

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::FrameSizeParam,_libaom_test::TestMode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool dummy [3];
  bool at_end;
  bool local_39;
  __tuple_element_t<1UL,_tuple<ParamIterator<const_CodecFactory_*>,_ParamIterator<FrameSizeParam>,_ParamIterator<TestMode>_>_>
  *in_stack_ffffffffffffffc8;
  ParamIterator<const_libaom_test::CodecFactory_*> *in_stack_ffffffffffffffd0;
  ParamIterator<(anonymous_namespace)::FrameSizeParam> *this_00;
  bool local_21;
  undefined8 local_b;
  
  local_b._2_1_ = 0;
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
              *)0x884bf3);
  std::
  get<0ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
              *)0x884c06);
  local_b._2_1_ =
       ParamIterator<const_libaom_test::CodecFactory_*>::operator==
                 (in_stack_ffffffffffffffd0,
                  (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffffc8);
  this_00 = (ParamIterator<(anonymous_namespace)::FrameSizeParam> *)&local_b;
  local_21 = true;
  if (!(bool)local_b._2_1_) {
    in_stack_ffffffffffffffc8 =
         std::
         get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
                   ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                     *)0x884c53);
    std::
    get<1ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                *)0x884c66);
    local_21 = ParamIterator<(anonymous_namespace)::FrameSizeParam>::operator==
                         (this_00,in_stack_ffffffffffffffc8);
  }
  local_b._2_1_ = local_21;
  *(bool *)&(this_00->impl_)._M_t.
            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::FrameSizeParam>_*,_false>
            ._M_head_impl = local_21;
  local_39 = true;
  if ((local_b._2_1_ & 1) == 0) {
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                *)0x884cb7);
    std::
    get<2ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,testing::internal::ParamIterator<libaom_test::TestMode>>
              ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::FrameSizeParam>,_testing::internal::ParamIterator<libaom_test::TestMode>_>
                *)0x884cca);
    local_39 = ParamIterator<libaom_test::TestMode>::operator==
                         ((ParamIterator<libaom_test::TestMode> *)this_00,
                          (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffffc8);
  }
  return local_39;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }